

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall Memory::Recycler::ResetMarks(Recycler *this,ResetMarkFlags flags)

{
  ObservableValueObserver<Memory::CollectionState> *pOVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  CollectionState local_2c;
  
  if ((this->collectionState).value == CollectionStateNotCollecting) {
    bVar3 = false;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x802,"(!this->CollectionInProgress())","!this->CollectionInProgress()");
    if (!bVar3) goto LAB_0070c6b4;
    *puVar4 = 0;
    bVar3 = (this->collectionState).value == CollectionStateResetMarks;
  }
  local_2c = CollectionStateResetMarks;
  pOVar1 = (this->collectionState).observer;
  if ((pOVar1 != (ObservableValueObserver<Memory::CollectionState> *)0x0) && (!bVar3)) {
    (**pOVar1->_vptr_ObservableValueObserver)(pOVar1,&local_2c,&this->collectionState);
  }
  (this->collectionState).value = local_2c;
  if (this->recyclerFlagsTable->Verbose == true) {
    bVar3 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,RecyclerPhase);
    if (bVar3) {
      Output::Print(L"Reset marks\n");
    }
  }
  bVar3 = IsMarkStackEmpty(this);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x809,"(IsMarkStackEmpty())","IsMarkStackEmpty()");
    if (!bVar3) {
LAB_0070c6b4:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  this->scanPinnedObjectMap = true;
  this->hasScannedInitialImplicitRoots = false;
  HeapBlockMap64::ResetMarks(&this->heapBlockMap);
  HeapInfoManager::ResetMarks(&this->autoHeap,flags);
  return;
}

Assistant:

void
Recycler::ResetMarks(ResetMarkFlags flags)
{
    Assert(!this->CollectionInProgress());
    this->SetCollectionState(CollectionStateResetMarks);

    RecyclerVerboseTrace(GetRecyclerFlagsTable(), _u("Reset marks\n"));
    GCETW(GC_RESETMARKS_START, (this));
    RECYCLER_PROFILE_EXEC_BEGIN(this, Js::ResetMarksPhase);

    Assert(IsMarkStackEmpty());
    this->scanPinnedObjectMap = true;
    this->hasScannedInitialImplicitRoots = false;

    heapBlockMap.ResetMarks();

    autoHeap.ResetMarks(flags);

    RECYCLER_PROFILE_EXEC_END(this, Js::ResetMarksPhase);
    GCETW(GC_RESETMARKS_STOP, (this));

#ifdef RECYCLER_MARK_TRACK
    this->ClearMarkMap();
#endif
}